

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::HebrewCalendar::handleComputeMonthStart
          (HebrewCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int16_t (*paiVar6) [3];
  int iVar7;
  UErrorCode status;
  HebrewCalendar *local_38;
  
  status = U_ZERO_ERROR;
  iVar7 = eyear * 0xc + 0x11;
  iVar1 = -7;
  iVar2 = 0xc;
  for (; month < 0; month = month + (iVar7 % 0x13 < iVar3 ^ 0xd)) {
    eyear = eyear + -1;
    iVar7 = iVar7 + -0xc;
    iVar3 = iVar2;
    if (iVar7 % 0x13 < 0) {
      iVar3 = iVar1;
    }
  }
  for (; 0xc < (uint)month; month = (month + (uint)(iVar4 < iVar3)) - 0xd) {
    eyear = eyear + 1;
    iVar4 = iVar7 % 0x13;
    iVar3 = iVar2;
    if (iVar4 < 0) {
      iVar3 = iVar1;
    }
    iVar7 = iVar7 + 0xc;
  }
  local_38 = this;
  iVar3 = startOfYear(eyear,&status);
  iVar4 = 0;
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (month != 0) {
      if (iVar7 % 0x13 < 0) {
        iVar2 = iVar1;
      }
      uVar5 = yearType(local_38,eyear);
      paiVar6 = LEAP_MONTH_START;
      if (iVar7 % 0x13 < iVar2) {
        paiVar6 = MONTH_START;
      }
      iVar3 = iVar3 + paiVar6[(uint)month][uVar5];
    }
    iVar4 = iVar3 + 0x54f5d;
  }
  return iVar4;
}

Assistant:

int32_t HebrewCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /*useMonth*/) const {
    UErrorCode status = U_ZERO_ERROR;
    // Resolve out-of-range months.  This is necessary in order to
    // obtain the correct year.  We correct to
    // a 12- or 13-month year (add/subtract 12 or 13, depending
    // on the year) but since we _always_ number from 0..12, and
    // the leap year determines whether or not month 5 (Adar 1)
    // is present, we allow 0..12 in any given year.
    while (month < 0) {
        month += monthsInYear(--eyear);
    }
    // Careful: allow 0..12 in all years
    while (month > 12) {
        month -= monthsInYear(eyear++);
    }

    int32_t day = startOfYear(eyear, status);

    if(U_FAILURE(status)) {
        return 0;
    }

    if (month != 0) {
        if (isLeapYear(eyear)) {
            day += LEAP_MONTH_START[month][yearType(eyear)];
        } else {
            day += MONTH_START[month][yearType(eyear)];
        }
    }

    return (int) (day + 347997);
}